

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O1

void xmlTextReaderFreeNodeList(xmlTextReaderPtr reader,xmlNodePtr cur)

{
  xmlElementType xVar1;
  _xmlNode *p_Var2;
  _xmlNode *p_Var3;
  _xmlAttr *p_Var4;
  xmlChar *str;
  xmlParserCtxtPtr pxVar5;
  xmlAttrPtr cur_00;
  int iVar6;
  xmlDeregisterNodeFunc *pp_Var7;
  xmlDictPtr local_40;
  long local_38;
  
  if (reader->ctxt == (xmlParserCtxtPtr)0x0) {
    local_40 = (xmlDictPtr)0x0;
  }
  else {
    local_40 = reader->ctxt->dict;
  }
  xVar1 = cur->type;
  if ((xVar1 != XML_DOCUMENT_NODE) && (xVar1 != XML_HTML_DOCUMENT_NODE)) {
    if (xVar1 != XML_NAMESPACE_DECL) {
      local_38 = 0;
      while( true ) {
        do {
          while ((((xVar1 = cur->type, xVar1 != XML_ENTITY_REF_NODE && (xVar1 != XML_DTD_NODE)) &&
                  (p_Var2 = cur->children, p_Var2 != (_xmlNode *)0x0)) && (p_Var2->parent == cur)))
          {
            local_38 = local_38 + 1;
            cur = p_Var2;
          }
          p_Var2 = cur->parent;
          p_Var3 = cur->next;
          if (xVar1 != XML_DTD_NODE) {
            if ((xmlRegisterCallbacks != 0) &&
               (pp_Var7 = __xmlDeregisterNodeDefaultValue(), *pp_Var7 != (xmlDeregisterNodeFunc)0x0)
               ) {
              pp_Var7 = __xmlDeregisterNodeDefaultValue();
              (**pp_Var7)(cur);
            }
            if ((cur->type < (XML_XINCLUDE_END|XML_ELEMENT_NODE)) &&
               ((0x180002U >> (cur->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)) {
              cur_00 = cur->properties;
              while (cur_00 != (xmlAttrPtr)0x0) {
                p_Var4 = cur_00->next;
                xmlTextReaderFreeProp(reader,cur_00);
                cur_00 = p_Var4;
              }
            }
            str = cur->content;
            if ((((_xmlAttr **)str != &cur->properties) &&
                (((XML_XINCLUDE_END < cur->type ||
                  ((0x180022U >> (cur->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0)) &&
                 (str != (xmlChar *)0x0)))) &&
               ((local_40 == (xmlDictPtr)0x0 || (iVar6 = xmlDictOwns(local_40,str), iVar6 == 0)))) {
              (*xmlFree)(cur->content);
            }
            if (((cur->type < (XML_XINCLUDE_END|XML_ELEMENT_NODE)) &&
                ((0x180002U >> (cur->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)) &&
               (cur->nsDef != (xmlNsPtr)0x0)) {
              xmlFreeNsList(cur->nsDef);
            }
            if ((((cur->type != XML_TEXT_NODE) && (cur->type != XML_COMMENT_NODE)) &&
                (cur->name != (xmlChar *)0x0)) &&
               ((local_40 == (xmlDictPtr)0x0 ||
                (iVar6 = xmlDictOwns(local_40,cur->name), iVar6 == 0)))) {
              (*xmlFree)(cur->name);
            }
            if ((((cur->type | XML_ATTRIBUTE_NODE) == XML_TEXT_NODE) &&
                (pxVar5 = reader->ctxt, pxVar5 != (xmlParserCtxtPtr)0x0)) &&
               (iVar6 = pxVar5->freeElemsNr, iVar6 < 100)) {
              cur->next = pxVar5->freeElems;
              pxVar5->freeElems = cur;
              pxVar5->freeElemsNr = iVar6 + 1;
            }
            else {
              (*xmlFree)(cur);
            }
          }
          cur = p_Var3;
        } while (p_Var3 != (_xmlNode *)0x0);
        if ((local_38 == 0) || (p_Var2 == (_xmlNode *)0x0)) break;
        local_38 = local_38 + -1;
        p_Var2->children = (_xmlNode *)0x0;
        cur = p_Var2;
      }
      return;
    }
    xmlFreeNsList((xmlNsPtr)cur);
    return;
  }
  xmlFreeDoc((xmlDocPtr)cur);
  return;
}

Assistant:

static void
xmlTextReaderFreeNodeList(xmlTextReaderPtr reader, xmlNodePtr cur) {
    xmlNodePtr next;
    xmlNodePtr parent;
    xmlDictPtr dict;
    size_t depth = 0;

    if ((reader != NULL) && (reader->ctxt != NULL))
	dict = reader->ctxt->dict;
    else
        dict = NULL;
    if (cur == NULL) return;
    if (cur->type == XML_NAMESPACE_DECL) {
	xmlFreeNsList((xmlNsPtr) cur);
	return;
    }
    if ((cur->type == XML_DOCUMENT_NODE) ||
	(cur->type == XML_HTML_DOCUMENT_NODE)) {
	xmlFreeDoc((xmlDocPtr) cur);
	return;
    }
    while (1) {
        while ((cur->type != XML_DTD_NODE) &&
               (cur->type != XML_ENTITY_REF_NODE) &&
               (cur->children != NULL) &&
               (cur->children->parent == cur)) {
            cur = cur->children;
            depth += 1;
        }

        next = cur->next;
        parent = cur->parent;

	/* unroll to speed up freeing the document */
	if (cur->type != XML_DTD_NODE) {

	    if ((xmlRegisterCallbacks) && (xmlDeregisterNodeDefaultValue))
		xmlDeregisterNodeDefaultValue(cur);

	    if (((cur->type == XML_ELEMENT_NODE) ||
		 (cur->type == XML_XINCLUDE_START) ||
		 (cur->type == XML_XINCLUDE_END)) &&
		(cur->properties != NULL))
		xmlTextReaderFreePropList(reader, cur->properties);
	    if ((cur->content != (xmlChar *) &(cur->properties)) &&
	        (cur->type != XML_ELEMENT_NODE) &&
		(cur->type != XML_XINCLUDE_START) &&
		(cur->type != XML_XINCLUDE_END) &&
		(cur->type != XML_ENTITY_REF_NODE)) {
		DICT_FREE(cur->content);
	    }
	    if (((cur->type == XML_ELEMENT_NODE) ||
	         (cur->type == XML_XINCLUDE_START) ||
		 (cur->type == XML_XINCLUDE_END)) &&
		(cur->nsDef != NULL))
		xmlFreeNsList(cur->nsDef);

	    /*
	     * we don't free element names here they are interned now
	     */
	    if ((cur->type != XML_TEXT_NODE) &&
		(cur->type != XML_COMMENT_NODE))
		DICT_FREE(cur->name);
	    if (((cur->type == XML_ELEMENT_NODE) ||
		 (cur->type == XML_TEXT_NODE)) &&
	        (reader != NULL) && (reader->ctxt != NULL) &&
		(reader->ctxt->freeElemsNr < MAX_FREE_NODES)) {
	        cur->next = reader->ctxt->freeElems;
		reader->ctxt->freeElems = cur;
		reader->ctxt->freeElemsNr++;
	    } else {
		xmlFree(cur);
	    }
	}

        if (next != NULL) {
	    cur = next;
        } else {
            if ((depth == 0) || (parent == NULL))
                break;
            depth -= 1;
            cur = parent;
            cur->children = NULL;
        }
    }
}